

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int parse_codes(archive_read *a)

{
  _func_int_archive_read_ptr **br;
  _func_int_archive_read_filter_ptr **lengths;
  _func_int_archive_read_filter_bidder_ptr_char_ptr_char_ptr **p;
  undefined1 uVar1;
  UInt32 size;
  archive_read *a_00;
  _func_int_archive_read_ptr *p_Var2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Bool BVar7;
  int iVar8;
  void *__s;
  byte bVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  char in_R8B;
  uint uVar16;
  huffman_code precode;
  uchar bitlengths [20];
  huffman_code local_88;
  byte local_58 [32];
  CPpmd7z_RangeDec *local_38;
  
  a_00 = (archive_read *)a->format->data;
  br = &a_00[7].formats[0xf].format_capabilties;
  free_codes(a_00);
  uVar4 = *(uint *)&a_00[7].formats[0xf].has_encrypted_entries & 0xfffffff8;
  *(uint *)&a_00[7].formats[0xf].has_encrypted_entries = uVar4;
  if ((int)uVar4 < 1) {
    iVar5 = rar_br_fillup(a,(rar_br *)br);
    uVar4 = *(uint *)&a_00[7].formats[0xf].has_encrypted_entries;
    if ((int)uVar4 < 1 && iVar5 == 0) goto LAB_003d009a;
  }
  iVar5 = uVar4 - 1;
  uVar11 = (ulong)a_00[7].formats[0xf].format_capabilties >> ((byte)iVar5 & 0x3f);
  *(byte *)((long)&a_00->bidders[0xd].init + 3) = (byte)uVar11 & 1;
  *(int *)&a_00[7].formats[0xf].has_encrypted_entries = iVar5;
  if ((uVar11 & 1) == 0) {
    if ((int)uVar4 < 2) {
      iVar6 = rar_br_fillup(a,(rar_br *)br);
      iVar5 = *(int *)&a_00[7].formats[0xf].has_encrypted_entries;
      if (iVar5 < 1 && iVar6 == 0) goto LAB_003d009a;
    }
    uVar11 = (ulong)(iVar5 - 1U);
    if (((ulong)*br >> (uVar11 & 0x3f) & 1) == 0) {
      memset(&a_00->bidders[3].init,0,0x194);
    }
    *(uint *)&a_00[7].formats[0xf].has_encrypted_entries = iVar5 - 1U;
    local_58[0] = 0;
    local_58[1] = 0;
    local_58[2] = 0;
    local_58[3] = 0;
    local_58[4] = 0;
    local_58[5] = 0;
    local_58[6] = 0;
    local_58[7] = 0;
    local_58[8] = 0;
    local_58[9] = 0;
    local_58[10] = 0;
    local_58[0xb] = 0;
    local_58[0xc] = 0;
    local_58[0xd] = 0;
    local_58[0xe] = 0;
    local_58[0xf] = 0;
    local_58[0x10] = 0;
    local_58[0x11] = 0;
    local_58[0x12] = 0;
    local_58[0x13] = 0;
    uVar13 = 0;
    do {
      iVar5 = (int)uVar11;
      if (iVar5 < 4) {
        iVar6 = rar_br_fillup(a,(rar_br *)br);
        iVar5 = *(int *)&a_00[7].formats[0xf].has_encrypted_entries;
        if (iVar5 < 4 && iVar6 == 0) goto LAB_003d009a;
      }
      uVar4 = iVar5 - 4;
      uVar11 = (ulong)uVar4;
      bVar9 = (byte)((ulong)a_00[7].formats[0xf].format_capabilties >> ((byte)uVar4 & 0x3f)) & 0xf;
      iVar6 = (int)uVar13;
      uVar15 = (ulong)iVar6;
      uVar13 = (ulong)(iVar6 + 1);
      local_58[uVar15] = bVar9;
      *(uint *)&a_00[7].formats[0xf].has_encrypted_entries = uVar4;
      if (bVar9 == 0xf) {
        if (iVar5 < 8) {
          iVar5 = rar_br_fillup(a,(rar_br *)br);
          uVar4 = *(uint *)&a_00[7].formats[0xf].has_encrypted_entries;
          if ((int)uVar4 < 4 && iVar5 == 0) goto LAB_003d009a;
        }
        uVar4 = uVar4 - 4;
        uVar11 = (ulong)uVar4;
        uVar12 = (ulong)a_00[7].formats[0xf].format_capabilties >> ((byte)uVar4 & 0x3f);
        *(uint *)&a_00[7].formats[0xf].has_encrypted_entries = uVar4;
        if ((uVar12 & 0xf) != 0) {
          uVar13 = (ulong)((uint)uVar12 & 0xf) + 1;
          if (0x13 - iVar6 <= uVar13) {
            uVar13 = (ulong)(0x13 - iVar6);
          }
          memset(local_58 + uVar15,0,uVar13 + 1);
          uVar4 = 1;
          do {
            uVar13 = uVar15 + 1;
            if ((byte)(((byte)uVar12 & 0xf) + 2) <= uVar4) break;
            uVar4 = uVar4 + 1;
            bVar3 = (long)uVar15 < 0x13;
            uVar15 = uVar13;
          } while (bVar3);
        }
      }
    } while ((int)uVar13 < 0x14);
    local_88.minlength = 0;
    local_88.maxlength = 0;
    local_88.tablesize = 0;
    local_88._28_4_ = 0;
    local_88.tree = (huffman_tree_node *)0x0;
    local_88.numentries = 0;
    local_88.numallocatedentries = 0;
    local_88.table = (huffman_table_entry *)0x0;
    iVar5 = create_code(a,&local_88,local_58,0x14,in_R8B);
    if (iVar5 != 0) {
      free(local_88.tree);
      free(local_88.table);
      return iVar5;
    }
    lengths = &a_00->bidders[3].init;
    uVar11 = 0;
    do {
      uVar4 = read_next_symbol(a,&local_88);
      if ((int)uVar4 < 0) {
        free(local_88.tree);
        free(local_88.table);
        return -0x1e;
      }
      iVar5 = (int)uVar11;
      if (uVar4 < 0x10) {
        *(byte *)((long)lengths + (long)iVar5) =
             (char)uVar4 + *(char *)((long)lengths + (long)iVar5) & 0xf;
        uVar11 = (ulong)(iVar5 + 1);
      }
      else if (uVar4 < 0x12) {
        if (iVar5 == 0) {
          free(local_88.tree);
          free(local_88.table);
          pcVar14 = "Internal error extracting RAR file.";
          goto LAB_003cff74;
        }
        iVar6 = *(int *)&a_00[7].formats[0xf].has_encrypted_entries;
        if (uVar4 == 0x10) {
          if (iVar6 < 3) {
            iVar8 = rar_br_fillup(a,(rar_br *)br);
            iVar6 = *(int *)&a_00[7].formats[0xf].has_encrypted_entries;
            if (iVar6 < 3 && iVar8 == 0) goto LAB_003d0086;
          }
          iVar6 = iVar6 + -3;
          iVar8 = 3;
          uVar4 = 7;
        }
        else {
          if (iVar6 < 7) {
            iVar8 = rar_br_fillup(a,(rar_br *)br);
            iVar6 = *(int *)&a_00[7].formats[0xf].has_encrypted_entries;
            if (iVar6 < 7 && iVar8 == 0) goto LAB_003d0086;
          }
          iVar6 = iVar6 + -7;
          iVar8 = 0xb;
          uVar4 = 0x7f;
        }
        p_Var2 = a_00[7].formats[0xf].format_capabilties;
        *(int *)&a_00[7].formats[0xf].has_encrypted_entries = iVar6;
        if (0x193 < iVar5) break;
        uVar1 = *(undefined1 *)((long)&a_00->bidders[3].bid + (long)iVar5 + 7U);
        uVar10 = 1;
        uVar13 = (long)iVar5;
        do {
          *(undefined1 *)((long)lengths + uVar13) = uVar1;
          uVar11 = uVar13 + 1;
          if ((uVar4 & (uint)((ulong)p_Var2 >> ((byte)iVar6 & 0x3f))) + iVar8 <= uVar10) break;
          uVar10 = uVar10 + 1;
          bVar3 = (long)uVar13 < 0x193;
          uVar13 = uVar11;
        } while (bVar3);
      }
      else {
        iVar6 = *(int *)&a_00[7].formats[0xf].has_encrypted_entries;
        if (uVar4 == 0x12) {
          if (iVar6 < 3) {
            iVar8 = rar_br_fillup(a,(rar_br *)br);
            iVar6 = *(int *)&a_00[7].formats[0xf].has_encrypted_entries;
            if (iVar6 < 3 && iVar8 == 0) {
LAB_003d0086:
              free(local_88.tree);
              free(local_88.table);
              goto LAB_003d009a;
            }
          }
          iVar6 = iVar6 + -3;
          iVar8 = 3;
          uVar4 = 7;
        }
        else {
          if (iVar6 < 7) {
            iVar8 = rar_br_fillup(a,(rar_br *)br);
            iVar6 = *(int *)&a_00[7].formats[0xf].has_encrypted_entries;
            if (iVar6 < 7 && iVar8 == 0) goto LAB_003d0086;
          }
          iVar6 = iVar6 + -7;
          iVar8 = 0xb;
          uVar4 = 0x7f;
        }
        p_Var2 = a_00[7].formats[0xf].format_capabilties;
        *(int *)&a_00[7].formats[0xf].has_encrypted_entries = iVar6;
        if (0x193 < iVar5) break;
        uVar16 = (uVar4 & (uint)((ulong)p_Var2 >> ((byte)iVar6 & 0x3f))) + iVar8;
        uVar4 = uVar16 - 1;
        uVar10 = 0x193U - iVar5;
        if (uVar4 < 0x193U - iVar5) {
          uVar10 = uVar4;
        }
        memset((void *)((long)lengths + (long)iVar5),0,(ulong)uVar10 + 1);
        uVar4 = 1;
        uVar13 = (long)iVar5;
        do {
          uVar11 = uVar13 + 1;
          if (uVar16 <= uVar4) break;
          uVar4 = uVar4 + 1;
          bVar3 = (long)uVar13 < 0x193;
          uVar13 = uVar11;
        } while (bVar3);
      }
    } while ((int)uVar11 < 0x194);
    free(local_88.tree);
    free(local_88.table);
    iVar5 = create_code(a,(huffman_code *)&a_00->bidders[0].name,(uchar *)lengths,299,in_R8B);
    if (iVar5 != 0) {
      return iVar5;
    }
    iVar5 = create_code(a,(huffman_code *)(a_00->bidders + 1),
                        (uchar *)((long)&a_00->bidders[9].options + 3),0x3c,in_R8B);
    if (iVar5 != 0) {
      return iVar5;
    }
    iVar5 = create_code(a,(huffman_code *)&a_00->bidders[1].free,
                        (uchar *)((long)&a_00->bidders[10].free + 7),0x11,in_R8B);
    if (iVar5 != 0) {
      return iVar5;
    }
    iVar5 = create_code(a,(huffman_code *)&a_00->bidders[2].options,(uchar *)&a_00->bidders[0xb].bid
                        ,0x1c,in_R8B);
    if (iVar5 != 0) {
      return iVar5;
    }
LAB_003cfec4:
    if ((*(int *)&(a_00->client).switcher != 0) && (a_00->bidders[0xc].data != (void *)0x0)) {
LAB_003cff52:
      *(undefined1 *)&a_00->bidders[0xd].init = 0;
      return 0;
    }
    pcVar14 = (a_00->archive).compression_name;
    uVar4 = 0x400000;
    if ((long)pcVar14 < 0x400000) {
      uVar4 = (uint)((ulong)pcVar14 >> 1) & 0x7fffffff | (uint)pcVar14;
      uVar4 = uVar4 >> 2 | uVar4;
      uVar4 = uVar4 >> 4 | uVar4;
      uVar4 = uVar4 >> 8 | uVar4;
      uVar4 = uVar4 >> 0x10 | uVar4;
      uVar4 = (uVar4 - (uVar4 >> 1)) * 2;
    }
    __s = realloc(a_00->bidders[0xc].data,(ulong)uVar4);
    if (__s != (void *)0x0) {
      a_00->bidders[0xc].data = __s;
      *(uint *)&(a_00->client).switcher = uVar4;
      memset(__s,0,(ulong)uVar4);
      *(uint *)&a_00->bidders[0xc].name = uVar4 - 1;
      goto LAB_003cff52;
    }
    pcVar14 = "Unable to allocate memory for uncompressed data.";
LAB_003d005c:
    iVar5 = 0xc;
  }
  else {
    if ((int)uVar4 < 8) {
      iVar6 = rar_br_fillup(a,(rar_br *)br);
      iVar5 = *(int *)&a_00[7].formats[0xf].has_encrypted_entries;
      if (iVar5 < 7 && iVar6 == 0) goto LAB_003d009a;
    }
    iVar6 = iVar5 + -7;
    uVar11 = (ulong)a_00[7].formats[0xf].format_capabilties >> ((byte)iVar6 & 0x3f);
    *(int *)&a_00[7].formats[0xf].has_encrypted_entries = iVar6;
    if ((uVar11 & 0x20) != 0) {
      if (iVar5 < 0xf) {
        iVar5 = rar_br_fillup(a,(rar_br *)br);
        iVar6 = *(int *)&a_00[7].formats[0xf].has_encrypted_entries;
        if (iVar6 < 8 && iVar5 == 0) goto LAB_003d009a;
      }
      iVar6 = iVar6 + -8;
      *(uint *)&(a_00->client).switcher =
           ((uint)((ulong)a_00[7].formats[0xf].format_capabilties >> ((byte)iVar6 & 0x3f)) & 0xff) *
           0x100000 + 0x100000;
      *(int *)&a_00[7].formats[0xf].has_encrypted_entries = iVar6;
    }
    if ((uVar11 & 0x40) == 0) {
      *(undefined4 *)((long)&a_00->bidders[0xd].init + 4) = 2;
    }
    else {
      if (iVar6 < 8) {
        iVar5 = rar_br_fillup(a,(rar_br *)br);
        iVar6 = *(int *)&a_00[7].formats[0xf].has_encrypted_entries;
        if (iVar6 < 8 && iVar5 == 0) {
LAB_003d009a:
          archive_set_error(&a->archive,0x54,"Truncated RAR file data");
          *(undefined1 *)&(a_00->client).skipper = 0;
          return -0x1e;
        }
      }
      uVar4 = (uint)((ulong)a_00[7].formats[0xf].format_capabilties >> ((byte)(iVar6 + -8) & 0x3f))
              & 0xff;
      *(uint *)((long)&a_00->bidders[0xe].name + 4) = uVar4;
      *(uint *)((long)&a_00->bidders[0xd].init + 4) = uVar4;
      *(int *)&a_00[7].formats[0xf].has_encrypted_entries = iVar6 + -8;
    }
    if ((uVar11 & 0x20) == 0) {
      if (*(char *)((long)&a_00->bidders[0xd].init + 1) == '\0') {
        pcVar14 = "Invalid PPMd sequence";
      }
      else {
        BVar7 = PpmdRAR_RangeDec_Init((CPpmd7z_RangeDec *)&a_00[7].formats[0xe].seek_data);
        if (BVar7 != 0) goto LAB_003cfec4;
LAB_003cff6a:
        pcVar14 = "Unable to initialize PPMd range decoder";
      }
    }
    else {
      uVar10 = (uint)uVar11 & 0x1f;
      uVar4 = uVar10 * 3 - 0x1d;
      if (uVar10 < 0x10) {
        uVar4 = uVar10 + 1;
      }
      if (uVar4 == 1) {
        pcVar14 = "Truncated RAR file data";
      }
      else {
        p = &a_00->bidders[0xd].options;
        Ppmd7_Free((CPpmd7 *)p);
        a_00[7].formats[0xf].bid = (_func_int_archive_read_ptr_int *)a;
        a_00[7].formats[0xf].options = ppmd_read;
        local_38 = (CPpmd7z_RangeDec *)&a_00[7].formats[0xe].seek_data;
        PpmdRAR_RangeDec_CreateVTable(local_38);
        a_00[7].formats[0xf].name = (char *)&a_00[7].formats[0xf].bid;
        Ppmd7_Construct((CPpmd7 *)p);
        size = *(UInt32 *)&(a_00->client).switcher;
        if (size != 0) {
          BVar7 = Ppmd7_Alloc((CPpmd7 *)p,size);
          if (BVar7 != 0) {
            BVar7 = PpmdRAR_RangeDec_Init(local_38);
            if (BVar7 == 0) goto LAB_003cff6a;
            Ppmd7_Init((CPpmd7 *)p,uVar4);
            *(undefined1 *)((long)&a_00->bidders[0xd].init + 1) = 1;
            goto LAB_003cfec4;
          }
          pcVar14 = "Out of memory";
          goto LAB_003d005c;
        }
        pcVar14 = "Invalid zero dictionary size";
      }
    }
LAB_003cff74:
    iVar5 = 0x54;
  }
  archive_set_error(&a->archive,iVar5,pcVar14);
  return -0x1e;
}

Assistant:

static int
parse_codes(struct archive_read *a)
{
  int i, j, val, n, r;
  unsigned char bitlengths[MAX_SYMBOLS], zerocount, ppmd_flags;
  unsigned int maxorder;
  struct huffman_code precode;
  struct rar *rar = (struct rar *)(a->format->data);
  struct rar_br *br = &(rar->br);

  free_codes(a);

  /* Skip to the next byte */
  rar_br_consume_unalined_bits(br);

  /* PPMd block flag */
  if (!rar_br_read_ahead(a, br, 1))
    goto truncated_data;
  if ((rar->is_ppmd_block = rar_br_bits(br, 1)) != 0)
  {
    rar_br_consume(br, 1);
    if (!rar_br_read_ahead(a, br, 7))
      goto truncated_data;
    ppmd_flags = rar_br_bits(br, 7);
    rar_br_consume(br, 7);

    /* Memory is allocated in MB */
    if (ppmd_flags & 0x20)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->dictionary_size = (rar_br_bits(br, 8) + 1) << 20;
      rar_br_consume(br, 8);
    }

    if (ppmd_flags & 0x40)
    {
      if (!rar_br_read_ahead(a, br, 8))
        goto truncated_data;
      rar->ppmd_escape = rar->ppmd7_context.InitEsc = rar_br_bits(br, 8);
      rar_br_consume(br, 8);
    }
    else
      rar->ppmd_escape = 2;

    if (ppmd_flags & 0x20)
    {
      maxorder = (ppmd_flags & 0x1F) + 1;
      if(maxorder > 16)
        maxorder = 16 + (maxorder - 16) * 3;

      if (maxorder == 1)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Truncated RAR file data");
        return (ARCHIVE_FATAL);
      }

      /* Make sure ppmd7_contest is freed before Ppmd7_Construct
       * because reading a broken file cause this abnormal sequence. */
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);

      rar->bytein.a = a;
      rar->bytein.Read = &ppmd_read;
      __archive_ppmd7_functions.PpmdRAR_RangeDec_CreateVTable(&rar->range_dec);
      rar->range_dec.Stream = &rar->bytein;
      __archive_ppmd7_functions.Ppmd7_Construct(&rar->ppmd7_context);

      if (rar->dictionary_size == 0) {
	      archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid zero dictionary size");
	      return (ARCHIVE_FATAL);
      }

      if (!__archive_ppmd7_functions.Ppmd7_Alloc(&rar->ppmd7_context,
        rar->dictionary_size))
      {
        archive_set_error(&a->archive, ENOMEM,
                          "Out of memory");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
      __archive_ppmd7_functions.Ppmd7_Init(&rar->ppmd7_context, maxorder);
      rar->ppmd_valid = 1;
    }
    else
    {
      if (!rar->ppmd_valid) {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid PPMd sequence");
        return (ARCHIVE_FATAL);
      }
      if (!__archive_ppmd7_functions.PpmdRAR_RangeDec_Init(&rar->range_dec))
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Unable to initialize PPMd range decoder");
        return (ARCHIVE_FATAL);
      }
    }
  }
  else
  {
    rar_br_consume(br, 1);

    /* Keep existing table flag */
    if (!rar_br_read_ahead(a, br, 1))
      goto truncated_data;
    if (!rar_br_bits(br, 1))
      memset(rar->lengthtable, 0, sizeof(rar->lengthtable));
    rar_br_consume(br, 1);

    memset(&bitlengths, 0, sizeof(bitlengths));
    for (i = 0; i < MAX_SYMBOLS;)
    {
      if (!rar_br_read_ahead(a, br, 4))
        goto truncated_data;
      bitlengths[i++] = rar_br_bits(br, 4);
      rar_br_consume(br, 4);
      if (bitlengths[i-1] == 0xF)
      {
        if (!rar_br_read_ahead(a, br, 4))
          goto truncated_data;
        zerocount = rar_br_bits(br, 4);
        rar_br_consume(br, 4);
        if (zerocount)
        {
          i--;
          for (j = 0; j < zerocount + 2 && i < MAX_SYMBOLS; j++)
            bitlengths[i++] = 0;
        }
      }
    }

    memset(&precode, 0, sizeof(precode));
    r = create_code(a, &precode, bitlengths, MAX_SYMBOLS, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK) {
      free(precode.tree);
      free(precode.table);
      return (r);
    }

    for (i = 0; i < HUFFMAN_TABLE_SIZE;)
    {
      if ((val = read_next_symbol(a, &precode)) < 0) {
        free(precode.tree);
        free(precode.table);
        return (ARCHIVE_FATAL);
      }
      if (val < 16)
      {
        rar->lengthtable[i] = (rar->lengthtable[i] + val) & 0xF;
        i++;
      }
      else if (val < 18)
      {
        if (i == 0)
        {
          free(precode.tree);
          free(precode.table);
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file.");
          return (ARCHIVE_FATAL);
        }

        if(val == 16) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for (j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
        {
          rar->lengthtable[i] = rar->lengthtable[i-1];
          i++;
        }
      }
      else
      {
        if(val == 18) {
          if (!rar_br_read_ahead(a, br, 3)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 3) + 3;
          rar_br_consume(br, 3);
        } else {
          if (!rar_br_read_ahead(a, br, 7)) {
            free(precode.tree);
            free(precode.table);
            goto truncated_data;
          }
          n = rar_br_bits(br, 7) + 11;
          rar_br_consume(br, 7);
        }

        for(j = 0; j < n && i < HUFFMAN_TABLE_SIZE; j++)
          rar->lengthtable[i++] = 0;
      }
    }
    free(precode.tree);
    free(precode.table);

    r = create_code(a, &rar->maincode, &rar->lengthtable[0], MAINCODE_SIZE,
                MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->offsetcode, &rar->lengthtable[MAINCODE_SIZE],
                OFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lowoffsetcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE],
                LOWOFFSETCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
    r = create_code(a, &rar->lengthcode,
                &rar->lengthtable[MAINCODE_SIZE + OFFSETCODE_SIZE +
                LOWOFFSETCODE_SIZE], LENGTHCODE_SIZE, MAX_SYMBOL_LENGTH);
    if (r != ARCHIVE_OK)
      return (r);
  }

  if (!rar->dictionary_size || !rar->lzss.window)
  {
    /* Seems as though dictionary sizes are not used. Even so, minimize
     * memory usage as much as possible.
     */
    void *new_window;
    unsigned int new_size;

    if (rar->unp_size >= DICTIONARY_MAX_SIZE)
      new_size = DICTIONARY_MAX_SIZE;
    else
      new_size = rar_fls((unsigned int)rar->unp_size) << 1;
    new_window = realloc(rar->lzss.window, new_size);
    if (new_window == NULL) {
      archive_set_error(&a->archive, ENOMEM,
                        "Unable to allocate memory for uncompressed data.");
      return (ARCHIVE_FATAL);
    }
    rar->lzss.window = (unsigned char *)new_window;
    rar->dictionary_size = new_size;
    memset(rar->lzss.window, 0, rar->dictionary_size);
    rar->lzss.mask = rar->dictionary_size - 1;
  }

  rar->start_new_table = 0;
  return (ARCHIVE_OK);
truncated_data:
  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                    "Truncated RAR file data");
  rar->valid = 0;
  return (ARCHIVE_FATAL);
}